

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_triangles(void *a,uint32_t **triangles)

{
  uint32_t uVar1;
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  uint8_t *__ptr_01;
  uint uVar2;
  ssize_t sVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint nr_of_indices;
  ulong uVar8;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_triangles;
  uint8_t *local_58;
  char *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  ulong uVar7;
  
  iVar6 = 0;
  if (*(int *)((long)a + 0x24) == 3) {
    sVar3 = read((int)&nr_of_triangles,(void *)0x4,1);
    if ((int)sVar3 == 0) {
      iVar6 = 0;
    }
    else {
      sVar3 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      uVar1 = nr_of_compressed_bytes;
      iVar5 = 0;
      iVar6 = 0;
      if ((int)sVar3 != 0) {
        uVar7 = (ulong)nr_of_compressed_bytes;
        pcVar4 = (char *)malloc(uVar7);
        sVar3 = read((int)pcVar4,(void *)0x1,uVar7);
        iVar6 = iVar5;
        if ((int)sVar3 != 0) {
          nr_of_indices = nr_of_triangles * 3;
          uVar7 = (ulong)nr_of_indices;
          local_38 = (uint8_t *)malloc(uVar7);
          uVar2 = LZ4_decompress_safe(pcVar4,(char *)local_38,uVar1,nr_of_indices);
          if (uVar2 != nr_of_indices) {
            __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x44e,"int trico_read_triangles(void *, uint32_t **)");
          }
          sVar3 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
          uVar1 = nr_of_compressed_bytes;
          if ((int)sVar3 != 0) {
            uVar8 = (ulong)nr_of_compressed_bytes;
            pcVar4 = (char *)realloc(pcVar4,uVar8);
            sVar3 = read((int)pcVar4,(void *)0x1,uVar8);
            if ((int)sVar3 != 0) {
              local_40 = (uint8_t *)malloc(uVar7);
              uVar2 = LZ4_decompress_safe(pcVar4,(char *)local_40,uVar1,nr_of_indices);
              if (uVar2 != nr_of_indices) {
                __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x457,"int trico_read_triangles(void *, uint32_t **)");
              }
              sVar3 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
              uVar1 = nr_of_compressed_bytes;
              if ((int)sVar3 != 0) {
                uVar8 = (ulong)nr_of_compressed_bytes;
                pcVar4 = (char *)realloc(pcVar4,uVar8);
                sVar3 = read((int)pcVar4,(void *)0x1,uVar8);
                if ((int)sVar3 != 0) {
                  local_48 = (uint8_t *)malloc(uVar7);
                  uVar2 = LZ4_decompress_safe(pcVar4,(char *)local_48,uVar1,nr_of_indices);
                  if (uVar2 != nr_of_indices) {
                    __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x460,"int trico_read_triangles(void *, uint32_t **)");
                  }
                  sVar3 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
                  if ((int)sVar3 != 0) {
                    pcVar4 = (char *)realloc(pcVar4,(ulong)nr_of_compressed_bytes);
                    sVar3 = read((int)pcVar4,(void *)0x1,(ulong)nr_of_compressed_bytes);
                    if ((int)sVar3 != 0) {
                      local_58 = (uint8_t *)malloc(uVar7);
                      local_50 = pcVar4;
                      uVar2 = LZ4_decompress_safe(pcVar4,(char *)local_58,nr_of_compressed_bytes,
                                                  nr_of_indices);
                      __ptr_01 = local_38;
                      __ptr_00 = local_40;
                      __ptr = local_48;
                      if (uVar2 != nr_of_indices) {
                        __assert_fail("bytes_decompressed == nr_of_triangles * 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x469,"int trico_read_triangles(void *, uint32_t **)");
                      }
                      if (triangles != (uint32_t **)0x0) {
                        trico_transpose_uint32_soa_to_aos
                                  (triangles,local_38,local_40,local_48,local_58,nr_of_indices);
                      }
                      free(local_50);
                      free(__ptr_01);
                      free(__ptr_00);
                      free(__ptr);
                      free(local_58);
                      read_next_stream_type((trico_archive *)a);
                      iVar6 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int trico_read_triangles(void* a, uint32_t** triangles)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_triangle_uint32_stream)
    return 0;

  uint32_t nr_of_triangles;
  if (!read(&nr_of_triangles, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_triangles * 3);
  assert(bytes_decompressed == nr_of_triangles * 3);

  if (triangles != NULL)
    trico_transpose_uint32_soa_to_aos(triangles, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_triangles * 3);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }